

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::keypoolrefill(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffa48;
  RPCArg *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffa58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa60;
  uint *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  allocator<char> *in_stack_fffffffffffffa88;
  iterator in_stack_fffffffffffffa90;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffffa98;
  string *in_stack_fffffffffffffaa0;
  Fallback *in_stack_fffffffffffffaa8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffab0;
  string *in_stack_fffffffffffffab8;
  RPCArg *in_stack_fffffffffffffac0;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  RPCResults local_488;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  allocator<char> local_421 [209];
  RPCMethodImpl *in_stack_fffffffffffffcb0;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::operator+(&in_stack_fffffffffffffa98->skip_type_check,&in_stack_fffffffffffffa90->m_names);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  tinyformat::format<unsigned_int>((char *)in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::__cxx11::string::string(in_stack_fffffffffffffa60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa48);
  RPCArg::RPCArg(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                 (Type)((ulong)in_stack_fffffffffffffab0 >> 0x20),in_stack_fffffffffffffaa8,
                 in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffaa8 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffa48);
  __l._M_len = (size_type)in_stack_fffffffffffffa98;
  __l._M_array = in_stack_fffffffffffffa90;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa88,__l,
             (allocator_type *)in_stack_fffffffffffffa80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  this_01 = (RPCResult *)&stack0xfffffffffffffb9e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  local_488.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &local_488;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa48);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),&in_stack_fffffffffffffac0->m_names,
             in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,(bool)skip_type_check);
  RPCResults::RPCResults(this_00,(RPCResult *)in_stack_fffffffffffffac0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  HelpExampleCli(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  HelpExampleRpc(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffa48,(string *)0x17d48e2);
  this = (RPCArg *)&stack0xfffffffffffffb50;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::keypoolrefill()::__0,void>
            (in_stack_fffffffffffffa58,(anon_class_1_0_00000001 *)in_stack_fffffffffffffa50);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffbb8,(string *)in_stack_fffffffffffffbb0,
             (string *)in_stack_fffffffffffffba8,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffba0,
             (RPCResults *)in_stack_fffffffffffffb98,(RPCExamples *)in_stack_fffffffffffffb90,
             in_stack_fffffffffffffcb0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_48a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_489);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb9e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb9f);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa58);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbbe);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbbf);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_421);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan keypoolrefill()
{
    return RPCHelpMan{"keypoolrefill",
                "\nFills the keypool."+
        HELP_REQUIRING_PASSPHRASE,
                {
                    {"newsize", RPCArg::Type::NUM, RPCArg::DefaultHint{strprintf("%u, or as set by -keypool", DEFAULT_KEYPOOL_SIZE)}, "The new keypool size"},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("keypoolrefill", "")
            + HelpExampleRpc("keypoolrefill", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (pwallet->IsLegacy() && pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: Private keys are disabled for this wallet");
    }

    LOCK(pwallet->cs_wallet);

    // 0 is interpreted by TopUpKeyPool() as the default keypool size given by -keypool
    unsigned int kpSize = 0;
    if (!request.params[0].isNull()) {
        if (request.params[0].getInt<int>() < 0)
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, expected valid size.");
        kpSize = (unsigned int)request.params[0].getInt<int>();
    }

    EnsureWalletIsUnlocked(*pwallet);
    pwallet->TopUpKeyPool(kpSize);

    if (pwallet->GetKeyPoolSize() < kpSize) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error refreshing keypool.");
    }

    return UniValue::VNULL;
},
    };
}